

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

uint __thiscall
ON_SubDVertex::SharpEdgeCount
          (ON_SubDVertex *this,bool bCountCreasesAsSharp,bool bEndCheck,ON_Interval *sharpness_range
          )

{
  ushort uVar1;
  ON_SubDEdgePtr *pOVar2;
  bool bVar3;
  uint uVar4;
  unsigned_short vei;
  ulong uVar5;
  ON_SubDEdge *this_00;
  double t0;
  double dVar6;
  double dVar7;
  double t1;
  double dVar8;
  double local_48;
  
  pOVar2 = this->m_edges;
  if (pOVar2 == (ON_SubDEdgePtr *)0x0) {
    uVar4 = 0;
    t1 = 0.0;
    t0 = 0.0;
  }
  else {
    uVar1 = this->m_edge_count;
    local_48 = 5.0;
    t1 = 0.0;
    t0 = 0.0;
    uVar4 = 0;
    for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
      this_00 = (ON_SubDEdge *)(pOVar2[uVar5].m_ptr & 0xfffffffffffffff8);
      if ((this_00 != (ON_SubDEdge *)0x0) && (this_00->m_face_count == 2)) {
        bVar3 = ON_SubDEdge::IsSharp(this_00);
        if (bVar3) {
          dVar6 = local_48;
          if (this_00->m_edge_tag != Crease) {
            dVar6 = ON_SubDEdge::EndSharpness(this_00,this);
          }
        }
        else if ((!bCountCreasesAsSharp) || (dVar6 = 5.0, this_00->m_edge_tag != Crease))
        goto LAB_005d1f95;
        if ((!bEndCheck) || (0.0 < dVar6)) {
          dVar7 = dVar6;
          dVar8 = dVar6;
          if ((uVar4 != 0) && ((dVar8 = t1, t0 <= dVar6 && (dVar7 = t0, t1 < dVar6)))) {
            dVar8 = dVar6;
          }
          uVar4 = uVar4 + 1;
          t0 = dVar7;
          t1 = dVar8;
        }
      }
LAB_005d1f95:
    }
  }
  ON_Interval::Set(sharpness_range,t0,t1);
  return uVar4;
}

Assistant:

unsigned int ON_SubDVertex::SharpEdgeCount(
  bool bCountCreasesAsSharp,
  bool bEndCheck,
  ON_Interval& sharpness_range
) const
{
  unsigned int sharp_edge_count = 0;
  double mins = 0.0;
  double maxs = 0.0;
  if (nullptr != m_edges)
  {
    for (unsigned short vei = 0; vei < m_edge_count; ++vei)
    {
      const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(m_edges[vei].m_ptr);
      if (nullptr == e || 2 != e->m_face_count)
        continue;
      if (false == e->IsSharp())
      {
        if (false == bCountCreasesAsSharp || false == e->IsCrease())
          continue;
      }
      const double s = e->IsCrease() ? ON_SubDEdgeSharpness::CreaseValue : e->EndSharpness(this);
      if (false == bEndCheck || s > 0.0)
      {
        if (0 == sharp_edge_count)
        {
          mins = s;
          maxs = s;
        }
        else if (s < mins)
          mins = s;
        else if (s > maxs)
          maxs = s;
        ++sharp_edge_count;
      }
    }
  }
  sharpness_range.Set(mins, maxs);
  return sharp_edge_count;
}